

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

unique_ptr<char_*[],_std::default_delete<char_*[]>_> __thiscall
CommandReader::args(CommandReader *this)

{
  size_type sVar1;
  char *pcVar2;
  type ppcVar3;
  long in_RSI;
  undefined8 local_28;
  size_t i;
  CommandReader *this_local;
  __array *args;
  
  if ((*(byte *)(in_RSI + 2) & 1) == 0) {
    std::unique_ptr<char*[],std::default_delete<char*[]>>::
    unique_ptr<std::default_delete<char*[]>,void>
              ((unique_ptr<char*[],std::default_delete<char*[]>> *)this);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RSI + 0x28));
    std::make_unique<char*[]>((size_t)this);
    for (local_28 = 0;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RSI + 0x28)), local_28 < sVar1; local_28 = local_28 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x28),local_28);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      ppcVar3 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                          ((unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)this,local_28);
      *ppcVar3 = pcVar2;
    }
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x28));
    ppcVar3 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                        ((unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)this,sVar1);
    *ppcVar3 = (char *)0x0;
  }
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char *[]> args() const {
    // same
    if (!this->enclosed) {
      auto empty = std::unique_ptr<char *[]>();
      return empty;
    }

    auto args = std::make_unique<char *[]>(this->arguments.size() + 1);

    for (size_t i = 0; i < this->arguments.size(); i++) {
      args[i] = (char *)this->arguments[i].c_str();
    }

    args[this->arguments.size()] = nullptr;

    return args;
  }